

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O2

void __thiscall TApp_FailSet_Test::TestBody(TApp_FailSet_Test *this)

{
  App *this_00;
  input_t *piVar1;
  bool bVar2;
  long lVar3;
  initializer_list<int> __l;
  allocator_type local_102;
  less<int> local_101;
  AssertHelper local_100;
  allocator local_f5;
  int choice;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  undefined4 local_e8;
  string local_d0 [32];
  string local_b0 [32];
  string local_90;
  string local_70;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_50;
  
  std::__cxx11::string::string((string *)&local_70,"-q,--quick",(allocator *)&local_100);
  local_f0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x200000001;
  local_e8 = 3;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_f0;
  CLI::std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&local_50,__l,&local_101,&local_102);
  std::__cxx11::string::string((string *)&local_90,"",&local_f5);
  this_00 = &(this->super_TApp).app;
  CLI::App::add_set<int>
            (this_00,&local_70,&choice,(set<int,_std::less<int>,_std::allocator<int>_> *)&local_50,
             &local_90);
  std::__cxx11::string::~string((string *)&local_90);
  CLI::std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_f0,"--quick",(allocator *)&local_100);
  std::__cxx11::string::string(local_d0,"3",(allocator *)&local_101);
  std::__cxx11::string::string(local_b0,"--quick=2",(allocator *)&local_102);
  piVar1 = &(this->super_TApp).args;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,&local_f0,
             &local_90);
  lVar3 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)&local_f0.ptr_ + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)&local_f0);
  testing::internal::AssertHelper::AssertHelper
            (&local_100,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x364,
             "Expected: run() throws an exception of type CLI::ArgumentMismatch.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f0);
  testing::internal::AssertHelper::~AssertHelper(&local_100);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_f0);
  CLI::App::reset(this_00);
  std::__cxx11::string::string((string *)&local_f0,"--quick=hello",(allocator *)&local_100);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,&local_f0,
             local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)&local_f0);
  testing::internal::AssertHelper::AssertHelper
            (&local_100,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x369,
             "Expected: run() throws an exception of type CLI::ConversionError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f0);
  testing::internal::AssertHelper::~AssertHelper(&local_100);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_f0);
  return;
}

Assistant:

TEST_F(TApp, FailSet) {

    int choice;
    app.add_set("-q,--quick", choice, {1, 2, 3});

    args = {"--quick", "3", "--quick=2"};
    EXPECT_THROW(run(), CLI::ArgumentMismatch);

    app.reset();

    args = {"--quick=hello"};
    EXPECT_THROW(run(), CLI::ConversionError);
}